

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O3

void __thiscall
cppcms::url_dispatcher::assign<disp>
          (url_dispatcher *this,string *regex,member_type member,disp *object,int e1,int e2,int e3,
          int e4,int e5)

{
  undefined4 in_register_00000084;
  undefined4 in_stack_00000020;
  member_type *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  local_48 = 0;
  local_50 = (member_type *)operator_new(0x18);
  *local_50 = member;
  local_50[1] = (member_type)object;
  local_50[2] = CONCAT44(in_register_00000084,e1);
  local_38 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_cppcms::url_dispatcher::binder5<disp>_>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_cppcms::url_dispatcher::binder5<disp>_>
             ::_M_manager;
  cppcms::url_dispatcher::assign(this,regex,&local_50,e2,e3,e4,e5,in_stack_00000020);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  return;
}

Assistant:

void assign(std::string const &regex,void (C::*member)(std::string,std::string,std::string,std::string,std::string),C *object,int e1,int e2,int e3,int e4,int e5)
		{
			assign(regex,binder5<C>(member,object),e1,e2,e3,e4,e5);
		}